

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf_weights.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar5;
  size_type sVar6;
  vw *pvVar7;
  long lVar8;
  long lVar9;
  reference pvVar10;
  byte *pbVar11;
  size_t sVar12;
  size_t sVar13;
  __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  *p_Var14;
  element_type *peVar15;
  ostream *poVar16;
  unsigned_long *puVar17;
  weight *pwVar18;
  void *this;
  ulong uVar19;
  ulong uVar20;
  size_t k_1;
  size_t i_1;
  features *right;
  size_t k;
  size_t i;
  features *left;
  example *ec;
  ofstream right_quadratic;
  ofstream right_linear;
  ofstream left_quadratic;
  ofstream left_linear;
  ofstream constant;
  ssize_t read;
  size_t len;
  char *line;
  FILE *file;
  dense_parameters *weights;
  uchar right_ns;
  uchar left_ns;
  size_t rank;
  char *location;
  size_t loc;
  string target;
  vw *model;
  exception *e;
  options_description desc;
  variables_map vm;
  string vwparams;
  string outdir;
  string infile;
  example *in_stack_ffffffffffffec18;
  vw *in_stack_ffffffffffffec20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffec28;
  dense_parameters *pdVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffec30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffec50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffec58;
  void *in_stack_ffffffffffffec70;
  trace_message_t in_stack_ffffffffffffec78;
  undefined8 in_stack_ffffffffffffec80;
  undefined1 uVar22;
  io_buf *in_stack_ffffffffffffec88;
  string *in_stack_ffffffffffffec90;
  size_t sVar23;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_stack_ffffffffffffecf8;
  undefined8 in_stack_ffffffffffffed00;
  options_description *in_stack_ffffffffffffed08;
  char **in_stack_ffffffffffffed10;
  undefined8 in_stack_ffffffffffffed18;
  int argc_00;
  byte local_11c1;
  ulong local_1118;
  size_t local_1110;
  ulong local_1100;
  size_t local_10f8;
  example *local_10e8;
  allocator local_10d9;
  string local_10d8 [39];
  allocator local_10b1;
  string local_10b0 [39];
  allocator local_1089;
  string local_1088 [32];
  string local_1068 [32];
  string local_1048 [32];
  string local_1028 [32];
  ostream local_1008;
  allocator local_e01;
  string local_e00 [39];
  allocator local_dd9;
  string local_dd8 [39];
  allocator local_db1;
  string local_db0 [32];
  string local_d90 [32];
  string local_d70 [32];
  string local_d50 [32];
  ostream local_d30;
  allocator local_b29;
  string local_b28 [39];
  allocator local_b01;
  string local_b00 [39];
  allocator local_ad9;
  string local_ad8 [32];
  string local_ab8 [32];
  string local_a98 [32];
  string local_a78 [32];
  ostream local_a58;
  allocator local_851;
  string local_850 [39];
  undefined1 local_829 [40];
  allocator local_801;
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  ostream local_780;
  allocator local_579;
  string local_578 [39];
  allocator local_551;
  string local_550 [32];
  string local_530 [32];
  string local_510 [32];
  undefined1 local_4f0 [512];
  __ssize_t local_2f0;
  size_t local_2e8;
  char *local_2e0;
  FILE *local_2d8;
  dense_parameters *local_2d0;
  bool local_2c2;
  bool local_2c1;
  ulong local_2c0;
  char *local_2b8;
  long local_2b0;
  allocator local_2a1;
  string local_2a0 [32];
  string local_280 [32];
  vw *local_260;
  uchar local_258 [7];
  allocator local_251;
  string local_250 [40];
  uchar local_228 [40];
  basic_parsed_options local_200 [40];
  uchar local_1d8 [15];
  allocator local_1c9;
  string local_1c8 [32];
  options_description local_1a8 [128];
  variables_map local_128 [160];
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  string local_30 [44];
  int local_4;
  
  uVar22 = (undefined1)((ulong)in_stack_ffffffffffffec80 >> 0x38);
  argc_00 = (int)((ulong)in_stack_ffffffffffffed18 >> 0x20);
  iVar3 = (int)((ulong)in_stack_ffffffffffffed00 >> 0x20);
  local_4 = 0;
  std::__cxx11::string::string(local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,".",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::__cxx11::string::string(local_88);
  boost::program_options::variables_map::variables_map(local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,"Allowed options",&local_1c9);
  boost::program_options::options_description::options_description
            (local_1a8,local_1c8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  local_1d8._0_8_ = boost::program_options::options_description::add_options();
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_1d8,"help,h");
  ptVar5 = boost::program_options::value<std::__cxx11::string>(in_stack_ffffffffffffec30);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"infile,I",(char *)ptVar5);
  ptVar5 = boost::program_options::value<std::__cxx11::string>(in_stack_ffffffffffffec30);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"outdir,O",(char *)ptVar5);
  ptVar5 = boost::program_options::value<std::__cxx11::string>(in_stack_ffffffffffffec30);
  boost::program_options::options_description_easy_init::operator()
            (pcVar4,(value_semantic *)"vwparams",(char *)ptVar5);
  local_228[0x10] = '\0';
  local_228[0x11] = '\0';
  local_228[0x12] = '\0';
  local_228[0x13] = '\0';
  local_228[0x14] = '\0';
  local_228[0x15] = '\0';
  local_228[0x16] = '\0';
  local_228[0x17] = '\0';
  local_228[0x18] = '\0';
  local_228[0x19] = '\0';
  local_228[0x1a] = '\0';
  local_228[0x1b] = '\0';
  local_228[0x1c] = '\0';
  local_228[0x1d] = '\0';
  local_228[0x1e] = '\0';
  local_228[0x1f] = '\0';
  local_228[0] = '\0';
  local_228[1] = '\0';
  local_228[2] = '\0';
  local_228[3] = '\0';
  local_228[4] = '\0';
  local_228[5] = '\0';
  local_228[6] = '\0';
  local_228[7] = '\0';
  local_228[8] = '\0';
  local_228[9] = '\0';
  local_228[10] = '\0';
  local_228[0xb] = '\0';
  local_228[0xc] = '\0';
  local_228[0xd] = '\0';
  local_228[0xe] = '\0';
  local_228[0xf] = '\0';
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *)0x1197b9);
  boost::program_options::parse_command_line<char>
            (argc_00,in_stack_ffffffffffffed10,in_stack_ffffffffffffed08,iVar3,
             in_stack_ffffffffffffecf8);
  boost::program_options::store(local_200,local_128,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options
            ((basic_parsed_options<char> *)0x119812);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)0x11981f);
  boost::program_options::notify(local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"help",&local_251);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)in_stack_ffffffffffffec30,in_stack_ffffffffffffec28);
  local_11c1 = 1;
  if (sVar6 == 0) {
    bVar2 = std::__cxx11::string::empty();
    local_11c1 = 1;
    if ((bVar2 & 1) == 0) {
      local_11c1 = std::__cxx11::string::empty();
    }
  }
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  if ((local_11c1 & 1) == 0) {
    std::__cxx11::string::string(local_280,local_88);
    pvVar7 = VW::initialize(in_stack_ffffffffffffec90,in_stack_ffffffffffffec88,(bool)uVar22,
                            in_stack_ffffffffffffec78,in_stack_ffffffffffffec70);
    std::__cxx11::string::~string(local_280);
    pvVar7->audit = true;
    local_260 = pvVar7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a0,"--rank ",&local_2a1);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
    local_2b0 = std::__cxx11::string::find(local_88,(ulong)local_2a0);
    lVar8 = std::__cxx11::string::c_str();
    lVar8 = lVar8 + local_2b0;
    lVar9 = std::__cxx11::string::size();
    local_2b8 = (char *)(lVar8 + lVar9);
    iVar3 = atoi(local_2b8);
    local_2c0 = (ulong)iVar3;
    pvVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&local_260->pairs,0);
    pbVar11 = (byte *)std::__cxx11::string::operator[]((ulong)pvVar10);
    local_2c1 = (bool)*pbVar11;
    pvVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&local_260->pairs,0);
    pbVar11 = (byte *)std::__cxx11::string::operator[]((ulong)pvVar10);
    local_2c2 = (bool)*pbVar11;
    local_2d0 = &(local_260->weights).dense_weights;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    local_2d8 = fopen64(pcVar4,"r");
    local_2e0 = (char *)0x0;
    local_2e8 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_550,"/",&local_551);
    std::operator+(in_stack_ffffffffffffec28,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffec20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_578,"constant",&local_579);
    std::operator+(in_stack_ffffffffffffec58,in_stack_ffffffffffffec50);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(local_4f0,pcVar4,_S_out);
    std::__cxx11::string::~string(local_510);
    std::__cxx11::string::~string(local_578);
    std::allocator<char>::~allocator((allocator<char> *)&local_579);
    std::__cxx11::string::~string(local_530);
    std::__cxx11::string::~string(local_550);
    std::allocator<char>::~allocator((allocator<char> *)&local_551);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_800,"/",&local_801);
    std::operator+(in_stack_ffffffffffffec28,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffec20);
    iVar3 = (int)local_2c1;
    pvVar7 = (vw *)local_829;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_829 + 1),1,(char)iVar3,(allocator *)pvVar7);
    std::operator+(in_stack_ffffffffffffec58,in_stack_ffffffffffffec50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_850,".linear",&local_851);
    std::operator+(in_stack_ffffffffffffec58,in_stack_ffffffffffffec50);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(&local_780,pcVar4,_S_out);
    std::__cxx11::string::~string(local_7a0);
    std::__cxx11::string::~string(local_850);
    std::allocator<char>::~allocator((allocator<char> *)&local_851);
    std::__cxx11::string::~string(local_7c0);
    std::__cxx11::string::~string((string *)(local_829 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_829);
    std::__cxx11::string::~string(local_7e0);
    std::__cxx11::string::~string(local_800);
    std::allocator<char>::~allocator((allocator<char> *)&local_801);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ad8,"/",&local_ad9);
    std::operator+(in_stack_ffffffffffffec28,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffec20);
    bVar1 = local_2c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b00,1,bVar1,&local_b01);
    std::operator+(in_stack_ffffffffffffec58,in_stack_ffffffffffffec50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b28,".quadratic",&local_b29);
    std::operator+(in_stack_ffffffffffffec58,in_stack_ffffffffffffec50);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(&local_a58,pcVar4,_S_out);
    std::__cxx11::string::~string(local_a78);
    std::__cxx11::string::~string(local_b28);
    std::allocator<char>::~allocator((allocator<char> *)&local_b29);
    std::__cxx11::string::~string(local_a98);
    std::__cxx11::string::~string(local_b00);
    std::allocator<char>::~allocator((allocator<char> *)&local_b01);
    std::__cxx11::string::~string(local_ab8);
    std::__cxx11::string::~string(local_ad8);
    std::allocator<char>::~allocator((allocator<char> *)&local_ad9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_db0,"/",&local_db1);
    std::operator+(in_stack_ffffffffffffec28,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffec20);
    bVar1 = local_2c2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_dd8,1,bVar1,&local_dd9);
    std::operator+(in_stack_ffffffffffffec58,in_stack_ffffffffffffec50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e00,".linear",&local_e01);
    std::operator+(in_stack_ffffffffffffec58,in_stack_ffffffffffffec50);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(&local_d30,pcVar4,_S_out);
    std::__cxx11::string::~string(local_d50);
    std::__cxx11::string::~string(local_e00);
    std::allocator<char>::~allocator((allocator<char> *)&local_e01);
    std::__cxx11::string::~string(local_d70);
    std::__cxx11::string::~string(local_dd8);
    std::allocator<char>::~allocator((allocator<char> *)&local_dd9);
    std::__cxx11::string::~string(local_d90);
    std::__cxx11::string::~string(local_db0);
    std::allocator<char>::~allocator((allocator<char> *)&local_db1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1088,"/",&local_1089);
    std::operator+(in_stack_ffffffffffffec28,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffec20);
    bVar1 = local_2c2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_10b0,1,bVar1,&local_10b1);
    std::operator+(in_stack_ffffffffffffec58,in_stack_ffffffffffffec50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_10d8,".quadratic",&local_10d9);
    std::operator+(in_stack_ffffffffffffec58,in_stack_ffffffffffffec50);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(&local_1008,pcVar4,_S_out);
    std::__cxx11::string::~string(local_1028);
    std::__cxx11::string::~string(local_10d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_10d9);
    std::__cxx11::string::~string(local_1048);
    std::__cxx11::string::~string(local_10b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_10b1);
    std::__cxx11::string::~string(local_1068);
    std::__cxx11::string::~string(local_1088);
    std::allocator<char>::~allocator((allocator<char> *)&local_1089);
    local_10e8 = (example *)0x0;
    while( true ) {
      local_2f0 = getline(&local_2e0,&local_2e8,local_2d8);
      uVar22 = (undefined1)((uint)iVar3 >> 0x18);
      if (local_2f0 == -1) break;
      pcVar4 = local_2e0;
      sVar12 = strlen(local_2e0);
      pcVar4[sVar12 - 1] = '\0';
      local_10e8 = VW::read_example(in_stack_ffffffffffffec20,(char *)in_stack_ffffffffffffec18);
      uVar19 = (ulong)local_2c1;
      local_10f8 = 0;
      while( true ) {
        sVar23 = local_10f8;
        sVar13 = features::size((features *)0x11a81d);
        if (sVar13 <= sVar23) break;
        p_Var14 = &v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&(local_10e8->super_example_predict).feature_space[uVar19].
                                 space_names,local_10f8)->
                   super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ;
        peVar15 = std::
                  __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ::get(p_Var14);
        poVar16 = std::operator<<(&local_780,(string *)&peVar15->second);
        poVar16 = std::operator<<(poVar16,'\t');
        pdVar21 = local_2d0;
        puVar17 = v_array<unsigned_long>::operator[]
                            (&(local_10e8->super_example_predict).feature_space[uVar19].indicies,
                             local_10f8);
        pwVar18 = dense_parameters::operator[](pdVar21,*puVar17);
        std::ostream::operator<<(poVar16,*pwVar18);
        p_Var14 = &v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&(local_10e8->super_example_predict).feature_space[uVar19].
                                 space_names,local_10f8)->
                   super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ;
        peVar15 = std::
                  __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ::get(p_Var14);
        std::operator<<(&local_a58,(string *)&peVar15->second);
        for (local_1100 = 1; local_1100 <= local_2c0; local_1100 = local_1100 + 1) {
          poVar16 = std::operator<<(&local_a58,'\t');
          pdVar21 = local_2d0;
          puVar17 = v_array<unsigned_long>::operator[]
                              (&(local_10e8->super_example_predict).feature_space[uVar19].indicies,
                               local_10f8);
          pwVar18 = dense_parameters::operator[](pdVar21,*puVar17 + local_1100);
          std::ostream::operator<<(poVar16,*pwVar18);
        }
        local_10f8 = local_10f8 + 1;
      }
      std::ostream::operator<<(&local_780,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(&local_a58,std::endl<char,std::char_traits<char>>);
      uVar20 = (ulong)local_2c2;
      local_1110 = 0;
      while( true ) {
        sVar23 = local_1110;
        sVar13 = features::size((features *)0x11b07d);
        if (sVar13 <= sVar23) break;
        p_Var14 = &v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&(local_10e8->super_example_predict).feature_space[uVar20].
                                 space_names,local_1110)->
                   super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ;
        peVar15 = std::
                  __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ::get(p_Var14);
        poVar16 = std::operator<<(&local_d30,(string *)&peVar15->second);
        poVar16 = std::operator<<(poVar16,'\t');
        pdVar21 = local_2d0;
        puVar17 = v_array<unsigned_long>::operator[]
                            (&(local_10e8->super_example_predict).feature_space[uVar19].indicies,
                             local_1110);
        pwVar18 = dense_parameters::operator[](pdVar21,*puVar17);
        std::ostream::operator<<(poVar16,*pwVar18);
        p_Var14 = &v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&(local_10e8->super_example_predict).feature_space[uVar20].
                                 space_names,local_1110)->
                   super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ;
        peVar15 = std::
                  __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ::get(p_Var14);
        std::operator<<(&local_1008,(string *)&peVar15->second);
        for (local_1118 = 1; local_1118 <= local_2c0; local_1118 = local_1118 + 1) {
          poVar16 = std::operator<<(&local_1008,'\t');
          pdVar21 = local_2d0;
          puVar17 = v_array<unsigned_long>::operator[]
                              (&(local_10e8->super_example_predict).feature_space[uVar19].indicies,
                               local_1110);
          pwVar18 = dense_parameters::operator[](pdVar21,*puVar17 + local_1118 + local_2c0);
          std::ostream::operator<<(poVar16,*pwVar18);
        }
        local_1110 = local_1110 + 1;
      }
      std::ostream::operator<<(&local_d30,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(&local_1008,std::endl<char,std::char_traits<char>>);
      VW::finish_example(in_stack_ffffffffffffec20,in_stack_ffffffffffffec18);
    }
    pdVar21 = local_2d0;
    puVar17 = v_array<unsigned_long>::operator[]
                        (&(local_10e8->super_example_predict).feature_space[0x80].indicies,0);
    in_stack_ffffffffffffec20 = (vw *)dense_parameters::operator[](pdVar21,*puVar17);
    this = (void *)std::ostream::operator<<(local_4f0,*(float *)&in_stack_ffffffffffffec20->sd);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    VW::finish(pvVar7,(bool)uVar22);
    fclose(local_2d8);
    std::ofstream::~ofstream(&local_1008);
    std::ofstream::~ofstream(&local_d30);
    std::ofstream::~ofstream(&local_a58);
    std::ofstream::~ofstream(&local_780);
    std::ofstream::~ofstream(local_4f0);
    std::__cxx11::string::~string(local_2a0);
    local_258[0] = '\0';
    local_258[1] = '\0';
    local_258[2] = '\0';
    local_258[3] = '\0';
  }
  else {
    poVar16 = std::operator<<((ostream *)&std::cout,
                              "Dumps weights for matrix factorization model (gd_mf).");
    std::ostream::operator<<(poVar16,std::endl<char,std::char_traits<char>>);
    poVar16 = std::operator<<((ostream *)&std::cout,
                              "The constant will be written to <outdir>/constant.");
    std::ostream::operator<<(poVar16,std::endl<char,std::char_traits<char>>);
    poVar16 = std::operator<<((ostream *)&std::cout,
                              "Linear and quadratic weights corresponding to the input features will be "
                             );
    std::ostream::operator<<(poVar16,std::endl<char,std::char_traits<char>>);
    poVar16 = std::operator<<((ostream *)&std::cout,
                              "written to <outdir>/<ns>.linear and <outdir>/<ns>.quadratic,respectively."
                             );
    std::ostream::operator<<(poVar16,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar16 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,local_1a8);
    std::operator<<(poVar16,"\n");
    poVar16 = std::operator<<((ostream *)&std::cout,"Example usage:");
    std::ostream::operator<<(poVar16,std::endl<char,std::char_traits<char>>);
    poVar16 = std::operator<<((ostream *)&std::cout,
                              "    Extract weights for user 42 and item 7 under randomly initialized rank 10 model:"
                             );
    std::ostream::operator<<(poVar16,std::endl<char,std::char_traits<char>>);
    poVar16 = std::operator<<((ostream *)&std::cout,
                              "    echo \'|u 42 |i 7\' | ./gd_mf_weights -I /dev/stdin --vwparams \'-q ui --rank 10\'"
                             );
    std::ostream::operator<<(poVar16,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
    local_258[0] = '\x01';
    local_258[1] = '\0';
    local_258[2] = '\0';
    local_258[3] = '\0';
  }
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_ffffffffffffec20);
  boost::program_options::variables_map::~variables_map((variables_map *)in_stack_ffffffffffffec20);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return local_4;
}

Assistant:

int main(int argc, char *argv[])
{ string infile;
  string outdir(".");
  string vwparams;

  po::variables_map vm;
  po::options_description desc("Allowed options");
  desc.add_options()
  ("help,h", "produce help message")
  ("infile,I", po::value<string>(&infile), "input (in vw format) of weights to extract")
  ("outdir,O", po::value<string>(&outdir), "directory to write model files to (default: .)")
  ("vwparams", po::value<string>(&vwparams), "vw parameters for model instantiation (-i model.reg -t ...")
  ;

  try
  { po::store(po::parse_command_line(argc, argv, desc), vm);
    po::notify(vm);
  }
  catch(exception & e)
  { cout << endl << argv[0] << ": " << e.what() << endl << endl << desc << endl;
    exit(2);
  }

  if (vm.count("help") || infile.empty() || vwparams.empty())
  { cout << "Dumps weights for matrix factorization model (gd_mf)." << endl;
    cout << "The constant will be written to <outdir>/constant." << endl;
    cout << "Linear and quadratic weights corresponding to the input features will be " << endl;
    cout << "written to <outdir>/<ns>.linear and <outdir>/<ns>.quadratic,respectively." << endl;
    cout << endl;
    cout << desc << "\n";
    cout << "Example usage:" << endl;
    cout << "    Extract weights for user 42 and item 7 under randomly initialized rank 10 model:" << endl;
    cout << "    echo '|u 42 |i 7' | ./gd_mf_weights -I /dev/stdin --vwparams '-q ui --rank 10'" << endl;
    return 1;
  }

  // initialize model
  vw* model = VW::initialize(vwparams);
  model->audit = true;

  string target("--rank ");
  size_t loc = vwparams.find(target);
  const char* location = vwparams.c_str()+loc+target.size();
  size_t rank = atoi(location);

  // global model params
  unsigned char left_ns = model->pairs[0][0];
  unsigned char right_ns = model->pairs[0][1];
  dense_parameters& weights = model->weights.dense_weights;

  // const char *filename = argv[0];
  FILE* file = fopen(infile.c_str(), "r");
  char* line = NULL;
  size_t len = 0;
  ssize_t read;

  // output files
  ofstream constant((outdir + string("/") + string("constant")).c_str()),
           left_linear((outdir + string("/") + string(1, left_ns) + string(".linear")).c_str()),
           left_quadratic((outdir + string("/") + string(1, left_ns) + string(".quadratic")).c_str()),
           right_linear((outdir + string("/") + string(1, right_ns) + string(".linear")).c_str()),
           right_quadratic((outdir + string("/") + string(1, right_ns) + string(".quadratic")).c_str());

  example *ec = NULL;
  while ((read = getline(&line, &len, file)) != -1)
  { line[strlen(line)-1] = 0; // chop

    ec = VW::read_example(*model, line);

    // write out features for left namespace
    features& left = ec->feature_space[left_ns];
    for (size_t i = 0; i < left.size(); ++i)
    { left_linear << left.space_names[i].get()->second << '\t' << weights[left.indicies[i]];

      left_quadratic << left.space_names[i].get()->second;
      for (size_t k = 1; k <= rank; k++)
        left_quadratic << '\t' << weights[(left.indicies[i] + k)];
    }
    left_linear << endl;
    left_quadratic << endl;

    // write out features for right namespace
    features& right = ec->feature_space[right_ns];
    for (size_t i = 0; i < right.size(); ++i)
    { right_linear << right.space_names[i].get()->second << '\t' << weights[left.indicies[i]];

      right_quadratic << right.space_names[i].get()->second;
      for (size_t k = 1; k <= rank; k++)
        right_quadratic << '\t' << weights[(left.indicies[i] + k + rank)];
    }
    right_linear << endl;
    right_quadratic << endl;

    VW::finish_example(*model, *ec);
  }

  // write constant
  constant << weights[ec->feature_space[constant_namespace].indicies[0]] << endl;

  // clean up
  VW::finish(*model);
  fclose(file);
}